

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psarrst.c
# Opt level: O0

void cf2_arrstack_init(CF2_ArrStack arrstack,FT_Memory memory,FT_Error *error,size_t sizeItem)

{
  size_t sizeItem_local;
  FT_Error *error_local;
  FT_Memory memory_local;
  CF2_ArrStack arrstack_local;
  
  arrstack->memory = memory;
  arrstack->error = error;
  arrstack->sizeItem = sizeItem;
  arrstack->allocated = 0;
  arrstack->count = 0;
  arrstack->totalSize = 0;
  arrstack->ptr = (void *)0x0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_arrstack_init( CF2_ArrStack  arrstack,
                     FT_Memory     memory,
                     FT_Error*     error,
                     size_t        sizeItem )
  {
    FT_ASSERT( arrstack );

    /* initialize the structure */
    arrstack->memory    = memory;
    arrstack->error     = error;
    arrstack->sizeItem  = sizeItem;
    arrstack->allocated = 0;
    arrstack->count     = 0;
    arrstack->totalSize = 0;
    arrstack->ptr       = NULL;
  }